

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

void Omega_h::vtk::write_array<int,int>
               (ostream *stream,string *name,Int ncomps,Read<int> *array,bool compress)

{
  int iVar1;
  char *file;
  undefined8 uVar2;
  void *data;
  int *piVar3;
  long lVar4;
  base64 local_228 [32];
  base64 local_208 [32];
  base64 local_1e8 [32];
  undefined8 local_1c8;
  uint64_t header [4];
  int ret;
  Bytef *compressed;
  uLong dest_bytes;
  uLong source_bytes;
  string encoded;
  string local_148 [8];
  string enc_header;
  uint64_t local_128;
  uint64_t uncompressed_bytes;
  undefined1 local_110 [8];
  HostRead<int> uncompressed;
  allocator local_c9;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [38];
  ScopedTimer local_62;
  byte local_61;
  ScopedTimer omega_h_scoped_function_timer;
  Read<int> *pRStack_60;
  bool compress_local;
  Read<int> *array_local;
  Int ncomps_local;
  string *name_local;
  ostream *stream_local;
  ulong local_10;
  
  local_61 = compress;
  pRStack_60 = array;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,&local_c9);
  std::operator+(local_a8,(char *)local_c8);
  std::__cxx11::to_string((__cxx11 *)&uncompressed.read_.write_.shared_alloc_.direct_ptr,0x7f);
  std::operator+(local_88,local_a8);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_62,"write_array",file);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&uncompressed.read_.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if ((array->write_).shared_alloc_.direct_ptr == (void *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    fail("vtk::write_array: \"%s\" doesn\'t exist\n",uVar2);
  }
  begin_code("header",(char *)0x0);
  std::operator<<(stream,"<DataArray ");
  describe_array<int>(stream,name,ncomps);
  std::operator<<(stream,">\n");
  end_code();
  Read<int>::Read((Read<int> *)&uncompressed_bytes,array);
  HostRead<int>::HostRead((HostRead<int> *)local_110,(Read<signed_char> *)&uncompressed_bytes);
  Read<int>::~Read((Read<int> *)&uncompressed_bytes);
  if (((ulong)(array->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((array->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(array->write_).shared_alloc_.alloc >> 3;
  }
  local_128 = (long)(int)(local_10 >> 2) << 2;
  std::__cxx11::string::string(local_148);
  std::__cxx11::string::string((string *)&source_bytes);
  if ((local_61 & 1) == 0) {
    begin_code("base64 bulk",(char *)0x0);
    base64::encode_abi_cxx11_(local_208,&local_128,8);
    std::__cxx11::string::operator=(local_148,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    piVar3 = HostRead<int>::data((HostRead<int> *)local_110);
    piVar3 = nonnull<int_const>(piVar3);
    base64::encode_abi_cxx11_(local_228,piVar3,local_128);
    std::__cxx11::string::operator=((string *)&source_bytes,(string *)local_228);
    std::__cxx11::string::~string((string *)local_228);
    end_code();
  }
  else {
    begin_code("zlib",(char *)0x0);
    dest_bytes = local_128;
    compressed = (Bytef *)compressBound(local_128);
    data = operator_new__((ulong)compressed);
    piVar3 = HostRead<int>::data((HostRead<int> *)local_110);
    piVar3 = nonnull<int_const>(piVar3);
    iVar1 = compress2(data,&compressed,piVar3,dest_bytes,1);
    end_code();
    if (iVar1 != 0) {
      fail("assertion %s failed at %s +%d\n","ret == Z_OK",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
           ,0x97);
    }
    begin_code("base64",(char *)0x0);
    base64::encode_abi_cxx11_((base64 *)(header + 3),data,(size_t)compressed);
    std::__cxx11::string::operator=((string *)&source_bytes,(string *)(header + 3));
    std::__cxx11::string::~string((string *)(header + 3));
    if (data != (void *)0x0) {
      operator_delete__(data);
    }
    local_1c8 = 1;
    header[0] = local_128;
    header[1] = local_128;
    header[2] = (uint64_t)compressed;
    base64::encode_abi_cxx11_(local_1e8,&local_1c8,0x20);
    std::__cxx11::string::operator=(local_148,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    end_code();
  }
  begin_code("stream bulk",(char *)0x0);
  lVar4 = std::__cxx11::string::data();
  std::__cxx11::string::length();
  std::ostream::write((char *)stream,lVar4);
  lVar4 = std::__cxx11::string::data();
  std::__cxx11::string::length();
  std::ostream::write((char *)stream,lVar4);
  std::ostream::write((char *)stream,0x73137e);
  end_code();
  begin_code("footer",(char *)0x0);
  std::operator<<(stream,"</DataArray>\n");
  end_code();
  std::__cxx11::string::~string((string *)&source_bytes);
  std::__cxx11::string::~string(local_148);
  HostRead<int>::~HostRead((HostRead<int> *)local_110);
  ScopedTimer::~ScopedTimer(&local_62);
  return;
}

Assistant:

void write_array(std::ostream& stream, std::string const& name, Int ncomps,
    Read<T_osh> array, bool compress) {
  OMEGA_H_TIME_FUNCTION;
  if (!(array.exists())) {
    Omega_h_fail("vtk::write_array: \"%s\" doesn't exist\n", name.c_str());
  }
  begin_code("header");
  stream << "<DataArray ";
  describe_array<T_vtk>(stream, name, ncomps);
  stream << ">\n";
  end_code();
  HostRead<T_osh> uncompressed(array);
  std::uint64_t uncompressed_bytes =
      sizeof(T_osh) * static_cast<uint64_t>(array.size());
  std::string enc_header;
  std::string encoded;
#ifdef OMEGA_H_USE_ZLIB
  if (compress) {
    begin_code("zlib");
    uLong source_bytes = uncompressed_bytes;
    uLong dest_bytes = ::compressBound(source_bytes);
    auto compressed = new ::Bytef[dest_bytes];
    int ret = ::compress2(compressed, &dest_bytes,
        reinterpret_cast<const ::Bytef*>(nonnull(uncompressed.data())),
        source_bytes, Z_BEST_SPEED);
    end_code();
    OMEGA_H_CHECK(ret == Z_OK);
    begin_code("base64");
    encoded = base64::encode(compressed, dest_bytes);
    delete[] compressed;
    std::uint64_t header[4] = {
        1, uncompressed_bytes, uncompressed_bytes, dest_bytes};
    enc_header = base64::encode(header, sizeof(header));
    end_code();
  } else
#else
  OMEGA_H_CHECK(!compress);
#endif
  {
    begin_code("base64 bulk");
    enc_header = base64::encode(&uncompressed_bytes, sizeof(std::uint64_t));
    encoded = base64::encode(nonnull(uncompressed.data()), uncompressed_bytes);
    end_code();
  }
  begin_code("stream bulk");
  // stream << enc_header << encoded << '\n';
  // the following three lines are 30% faster than the above line
  stream.write(enc_header.data(), std::streamsize(enc_header.length()));
  stream.write(encoded.data(), std::streamsize(encoded.length()));
  stream.write("\n", 1);
  end_code();
  begin_code("footer");
  stream << "</DataArray>\n";
  end_code();
}